

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O2

void writeBank(SortedSection *bankSections,uint16_t baseOffset,uint16_t size)

{
  ushort uVar1;
  Section *pSVar2;
  ushort uVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  uint16_t i;
  ushort uVar5;
  
  uVar3 = 0;
  while( true ) {
    if (bankSections == (SortedSection *)0x0) {
      if (disablePadding == false) {
        for (; uVar3 < size; uVar3 = uVar3 + 1) {
          if (overlayFile == (FILE *)0x0) {
            uVar4 = (uint)padValue;
          }
          else {
            uVar4 = getc((FILE *)overlayFile);
          }
          putc(uVar4,(FILE *)outputFile);
        }
      }
      return;
    }
    pSVar2 = bankSections->section;
    if (pSVar2->offset != 0) break;
    for (; (uint)uVar3 + (int)CONCAT62(in_register_00000032,baseOffset) < (uint)pSVar2->org;
        uVar3 = uVar3 + 1) {
      if (overlayFile == (FILE *)0x0) {
        uVar4 = (uint)padValue;
      }
      else {
        uVar4 = getc((FILE *)overlayFile);
      }
      putc(uVar4,(FILE *)outputFile);
    }
    fwrite(pSVar2->data,1,(ulong)pSVar2->size,(FILE *)outputFile);
    if (overlayFile == (FILE *)0x0) {
      uVar1 = pSVar2->size;
    }
    else {
      for (uVar5 = 0; uVar1 = pSVar2->size, uVar5 < uVar1; uVar5 = uVar5 + 1) {
        getc((FILE *)overlayFile);
      }
    }
    uVar3 = uVar1 + uVar3;
    bankSections = bankSections->next;
  }
  __assert_fail("section->offset == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/link/output.cpp"
                ,0xcb,"writeBank");
}

Assistant:

static void writeBank(struct SortedSection *bankSections, uint16_t baseOffset,
		      uint16_t size)
{
	uint16_t offset = 0;

	while (bankSections) {
		struct Section const *section = bankSections->section;

		assert(section->offset == 0);
		// Output padding up to the next SECTION
		while (offset + baseOffset < section->org) {
			putc(overlayFile ? getc(overlayFile) : padValue, outputFile);
			offset++;
		}

		// Output the section itself
		fwrite(section->data, sizeof(*section->data), section->size,
		       outputFile);
		if (overlayFile) {
			// Skip bytes even with pipes
			for (uint16_t i = 0; i < section->size; i++)
				getc(overlayFile);
		}
		offset += section->size;

		bankSections = bankSections->next;
	}

	if (!disablePadding) {
		while (offset < size) {
			putc(overlayFile ? getc(overlayFile) : padValue, outputFile);
			offset++;
		}
	}
}